

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O0

void google::protobuf::internal::ArenaStringPtr::InternalSwap
               (ArenaStringPtr *rhs,ArenaStringPtr *lhs,Arena *arena)

{
  Arena *arena_local;
  ArenaStringPtr *lhs_local;
  ArenaStringPtr *rhs_local;
  
  std::swap<google::protobuf::internal::TaggedStringPtr>(&lhs->tagged_ptr_,&rhs->tagged_ptr_);
  return;
}

Assistant:

PROTOBUF_NDEBUG_INLINE void ArenaStringPtr::InternalSwap(ArenaStringPtr* rhs,
                                                         ArenaStringPtr* lhs,
                                                         Arena* arena) {
  // Silence unused variable warnings in release buildls.
  (void)arena;
  std::swap(lhs->tagged_ptr_, rhs->tagged_ptr_);
  if (internal::DebugHardenForceCopyInSwap()) {
    for (auto* p : {lhs, rhs}) {
      if (p->IsDefault()) continue;
      std::string* old_value = p->tagged_ptr_.Get();
      std::string* new_value =
          p->IsFixedSizeArena()
              ? Arena::Create<std::string>(arena, *old_value)
              : Arena::Create<std::string>(arena, std::move(*old_value));
      if (arena == nullptr) {
        delete old_value;
        p->tagged_ptr_.SetAllocated(new_value);
      } else {
        p->tagged_ptr_.SetMutableArena(new_value);
      }
    }
  }
}